

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O1

void __thiscall TSMuxer::openDstFile(TSMuxer *this)

{
  FileFactory *pFVar1;
  int iVar2;
  undefined4 extraout_var;
  File *this_00;
  undefined4 *puVar3;
  ostringstream ss;
  uint *local_1b0;
  undefined8 local_1a8;
  uint local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  ostringstream local_190 [376];
  
  pFVar1 = (this->super_AbstractMuxer).m_fileFactory;
  if (pFVar1 == (FileFactory *)0x0) {
    this_00 = (File *)operator_new(0x38);
    File::File(this_00);
  }
  else {
    iVar2 = (*pFVar1->_vptr_FileFactory[2])();
    this_00 = (File *)CONCAT44(extraout_var,iVar2);
  }
  this->m_muxFile = &this_00->super_AbstractOutputStream;
  iVar2 = (*(this_00->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[2])
                    (this_00,(this->m_outFileName)._M_dataplus._M_p,2,0);
  if ((char)iVar2 != '\0') {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Can\'t create file ",0x12);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,(this->m_outFileName)._M_dataplus._M_p,
             (this->m_outFileName)._M_string_length);
  puVar3 = (undefined4 *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  *puVar3 = 0x67;
  *(undefined4 **)(puVar3 + 2) = puVar3 + 6;
  if (local_1b0 == &local_1a0) {
    puVar3[6] = local_1a0;
    puVar3[7] = uStack_19c;
    puVar3[8] = uStack_198;
    puVar3[9] = uStack_194;
  }
  else {
    *(uint **)(puVar3 + 2) = local_1b0;
    *(ulong *)(puVar3 + 6) = CONCAT44(uStack_19c,local_1a0);
  }
  *(undefined8 *)(puVar3 + 4) = local_1a8;
  local_1a0 = local_1a0 & 0xffffff00;
  __cxa_throw(puVar3,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
}

Assistant:

void TSMuxer::openDstFile()
{
    m_muxFile = m_fileFactory ? m_fileFactory->createFile() : new File();

    int systemFlags = 0;
#ifdef _WIN32
    if (m_owner->isAsyncMode())
        systemFlags += FILE_FLAG_NO_BUFFERING;
#endif
    if (!m_muxFile->open(m_outFileName.c_str(), File::ofWrite, systemFlags))
        THROW(ERR_CANT_CREATE_FILE, "Can't create file " << m_outFileName)
}